

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  void *__ptr;
  long lVar1;
  undefined8 *__ptr_00;
  int i;
  
  __ptr = malloc(0x14);
  for (lVar1 = 0; lVar1 != 0x14; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)__ptr + lVar1) = *(undefined4 *)((long)&DAT_00102010 + lVar1);
  }
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    printf("%i ",(ulong)*(uint *)((long)__ptr + lVar1 * 4));
  }
  putchar(10);
  free(__ptr);
  __ptr_00 = (undefined8 *)malloc(0xd);
  *__ptr_00 = 0x6f57206f6c6c6548;
  *(undefined8 *)((long)__ptr_00 + 5) = 0x21646c726f5720;
  printf("char_ptr = %s\n",__ptr_00);
  free(__ptr_00);
  return 0;
}

Assistant:

int main() {

    int nums[] = {1, 2, 3, 4, 5};

    int *num_ptr;

    num_ptr = (int *)malloc(5 * sizeof(int));

    for (int i = 0; i < sizeof(nums)/sizeof(int); i++) {
        num_ptr[i] = nums[i];
    }

    for (int i = 0; i < sizeof(nums)/sizeof(int); i++) {
        printf("%i ", num_ptr[i]);
    }
    printf("\n");

    free(num_ptr);

    /* char str[] = {'h','e','l','l','o','\0'}; */
    char *str = "Hello World!";

    char *char_ptr;

    char_ptr = (char *)malloc(strlen(str)+1);

    /*
    for (int i = 0; i < strlen(str) + 1; i++) {
        char_ptr[i] = str[i];
    }
    */
    strcpy(char_ptr, str);

    printf("char_ptr = %s\n", char_ptr);

    free(char_ptr);

    return 0;
}